

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

void __thiscall AddressFilter::AddToList(AddressFilter *this,uint8_t *addr,size_t len)

{
  ulong in_RAX;
  IPAsKey *this_00;
  bool stored;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  this_00 = (IPAsKey *)operator_new(0x30);
  IPAsKey::IPAsKey(this_00,addr,len);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  BinHash<IPAsKey>::InsertOrAdd(&this->table,this_00,false,(bool *)((long)&uStack_28 + 7));
  if (uStack_28._7_1_ == '\0') {
    (*this_00->_vptr_IPAsKey[1])(this_00);
  }
  return;
}

Assistant:

void AddressFilter::AddToList(uint8_t * addr, size_t len)
{
    IPAsKey * x = new IPAsKey(addr, len);

    if (x != NULL)
    {
        bool stored = false;

        (void)table.InsertOrAdd(x, false, &stored);

        if (!stored)
        {
            delete x;
        }
    }
}